

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_function.hpp
# Opt level: O2

void duckdb::MultiFileFunction<duckdb::ParquetMultiFileInfo>::MultiFileComplexFilterPushdown
               (ClientContext *context,LogicalGet *get,FunctionData *bind_data_p,
               vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               *filters)

{
  shared_ptr<duckdb::MultiFileList,_true> *this;
  pointer pMVar1;
  type pMVar2;
  MultiFilePushdownInfo info;
  _Head_base<0UL,_duckdb::MultiFileList_*,_false> local_78;
  MultiFilePushdownInfo local_70;
  
  MultiFilePushdownInfo::MultiFilePushdownInfo(&local_70,get);
  pMVar1 = unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>::
           operator->((unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
                       *)(bind_data_p + 7));
  this = (shared_ptr<duckdb::MultiFileList,_true> *)(bind_data_p + 5);
  pMVar2 = shared_ptr<duckdb::MultiFileList,_true>::operator*(this);
  (*pMVar1->_vptr_MultiFileReader[5])
            (&local_78,pMVar1,context,pMVar2,bind_data_p + 0x13,&local_70,filters);
  if (local_78._M_head_impl != (MultiFileList *)0x0) {
    shared_ptr<duckdb::MultiFileList,_true>::
    operator=<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>,_true,_0>
              (this,(unique_ptr<duckdb::MultiFileList,_std::default_delete<duckdb::MultiFileList>,_true>
                     *)&local_78);
    pMVar2 = shared_ptr<duckdb::MultiFileList,_true>::operator*(this);
    MultiFileReader::PruneReaders<duckdb::MultiFileBindData>
              ((MultiFileBindData *)bind_data_p,pMVar2);
    if (local_78._M_head_impl != (MultiFileList *)0x0) {
      (*(local_78._M_head_impl)->_vptr_MultiFileList[1])();
    }
  }
  MultiFilePushdownInfo::~MultiFilePushdownInfo(&local_70);
  return;
}

Assistant:

static void MultiFileComplexFilterPushdown(ClientContext &context, LogicalGet &get, FunctionData *bind_data_p,
	                                           vector<unique_ptr<Expression>> &filters) {
		auto &data = bind_data_p->Cast<MultiFileBindData>();

		MultiFilePushdownInfo info(get);
		auto new_list =
		    data.multi_file_reader->ComplexFilterPushdown(context, *data.file_list, data.file_options, info, filters);

		if (new_list) {
			data.file_list = std::move(new_list);
			MultiFileReader::PruneReaders(data, *data.file_list);
		}
	}